

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

void __thiscall QPostEventList::addEvent(QPostEventList *this,QPostEvent *ev)

{
  long i;
  iterator iVar1;
  ulong uVar2;
  ulong uVar4;
  QPostEvent *pQVar5;
  ulong uVar3;
  
  i = (this->super_QList<QPostEvent>).d.size;
  if (((i != 0) && ((this->super_QList<QPostEvent>).d.ptr[i + -1].priority < ev->priority)) &&
     (this->insertionOffset < i)) {
    iVar1 = QList<QPostEvent>::begin(&this->super_QList<QPostEvent>);
    pQVar5 = iVar1.i + this->insertionOffset;
    iVar1 = QList<QPostEvent>::end(&this->super_QList<QPostEvent>);
    if (0 < (long)iVar1.i - (long)pQVar5) {
      uVar3 = ((ulong)((long)iVar1.i - (long)pQVar5) >> 3) * -0x5555555555555555;
      do {
        uVar2 = uVar3 >> 1;
        uVar4 = uVar2;
        if (ev->priority <= pQVar5[uVar2].priority) {
          uVar4 = ~uVar2 + uVar3;
          pQVar5 = pQVar5 + uVar2 + 1;
        }
        uVar3 = uVar4;
      } while (0 < (long)uVar4);
    }
    QtPrivate::QMovableArrayOps<QPostEvent>::insert
              ((QMovableArrayOps<QPostEvent> *)this,
               ((long)pQVar5 - (long)(this->super_QList<QPostEvent>).d.ptr >> 3) *
               -0x5555555555555555,1,ev);
    QList<QPostEvent>::begin(&this->super_QList<QPostEvent>);
    return;
  }
  QtPrivate::QMovableArrayOps<QPostEvent>::emplace<QPostEvent_const&>
            ((QMovableArrayOps<QPostEvent> *)this,i,ev);
  QList<QPostEvent>::end(&this->super_QList<QPostEvent>);
  return;
}

Assistant:

void QPostEventList::addEvent(const QPostEvent &ev)
{
    int priority = ev.priority;
    if (isEmpty() ||
            constLast().priority >= priority ||
            insertionOffset >= size()) {
        // optimization: we can simply append if the last event in
        // the queue has higher or equal priority
        append(ev);
    } else {
        // insert event in descending priority order, using upper
        // bound for a given priority (to ensure proper ordering
        // of events with the same priority)
        QPostEventList::iterator at = std::upper_bound(begin() + insertionOffset, end(), ev);
        insert(at, ev);
    }
}